

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void pick_sb_modes(AV1_COMP *cpi,TileDataEnc *tile_data,MACROBLOCK *x,int mi_row,int mi_col,
                  RD_STATS *rd_cost,PARTITION_TYPE partition,BLOCK_SIZE bsize,PICK_MODE_CONTEXT *ctx
                  ,RD_STATS best_rd)

{
  int mi_col_00;
  uint uVar1;
  AV1_COMMON *cm_00;
  undefined4 in_ECX;
  MB_MODE_INFO *in_RDX;
  long in_RDI;
  undefined4 in_R8D;
  MACROBLOCK *in_R9;
  PICK_MODE_CONTEXT *unaff_retaddr;
  undefined1 in_stack_00000008;
  BLOCK_SIZE in_stack_0000000f;
  byte in_stack_00000010;
  undefined7 in_stack_00000011;
  macroblock *in_stack_00000018;
  AV1_COMP *in_stack_00000020;
  int orig_rdmult;
  int i;
  TxfmSearchInfo *txfm_info;
  AQ_MODE aq_mode;
  macroblockd_plane *pd;
  macroblock_plane *p;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int num_planes;
  AV1_COMMON *cm;
  RD_STATS *in_stack_000001c0;
  int in_stack_000001c8;
  int in_stack_000001cc;
  MACROBLOCK *in_stack_000001d0;
  TileDataEnc *in_stack_000001d8;
  AV1_COMP *in_stack_000001e0;
  BLOCK_SIZE in_stack_000001f0;
  PICK_MODE_CONTEXT *in_stack_000001f8;
  int64_t in_stack_00000200;
  PICK_MODE_CONTEXT *in_stack_000057f8;
  BLOCK_SIZE in_stack_00005807;
  RD_STATS *in_stack_00005808;
  macroblock *in_stack_00005810;
  TileDataEnc *in_stack_00005818;
  AV1_COMP *in_stack_00005820;
  int64_t in_stack_00005860;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 uVar3;
  undefined8 uVar2;
  RD_STATS *rd_cost_00;
  undefined8 in_stack_ffffffffffffff70;
  undefined4 uVar4;
  buf_2d *ref;
  int mult;
  MACROBLOCKD *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  BLOCK_SIZE in_stack_ffffffffffffff87;
  RD_STATS *rd_stats;
  undefined4 in_stack_ffffffffffffff90;
  int mi_col_01;
  undefined4 in_stack_ffffffffffffff94;
  int iVar5;
  MACROBLOCK *x_00;
  undefined7 in_stack_ffffffffffffffa0;
  BLOCK_SIZE in_stack_ffffffffffffffa7;
  char cVar6;
  undefined8 in_stack_ffffffffffffffa8;
  int8_t *piVar7;
  MACROBLOCK *in_stack_ffffffffffffffb0;
  MB_MODE_INFO *mbmi_00;
  TileInfo *in_stack_ffffffffffffffb8;
  RD_STATS *pRVar8;
  AV1_COMP *in_stack_ffffffffffffffc0;
  INTERINTRA_MODE *pIVar9;
  int in_stack_ffffffffffffffc8;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  rd_stats = (RD_STATS *)&stack0x00000020;
  if ((*(int *)(in_RDI + 0x609dc) == 0) || (-1 < (long)txfm_info)) {
    av1_set_offsets(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                    (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8,
                    in_stack_ffffffffffffffa7);
    iVar5 = (int)in_stack_ffffffffffffffb8;
    if ((*(int *)(in_RDI + 0x609d4) == 0) || ((in_stack_00000018->e_mbd).plane[0].dst.width == 0)) {
      cm_00 = (AV1_COMMON *)(in_RDI + 0x3bf80);
      mi_col_00 = av1_num_planes(cm_00);
      pIVar9 = &in_RDX[2].interintra_mode;
      piVar7 = &in_RDX[2].interinter_comp.wedge_index;
      cVar6 = *(char *)(in_RDI + 0x42400);
      x_00 = (MACROBLOCK *)(in_RDX[0x35a].wm_params.wmmat + 3);
      uVar2 = CONCAT44(uVar3,in_ECX);
      ref = (buf_2d *)CONCAT44(uVar4,in_R8D);
      mbmi_00 = in_RDX;
      wait_for_top_right_sb
                ((AV1EncRowMultiThreadInfo *)CONCAT17(cVar6,in_stack_ffffffffffffffa0),
                 (AV1EncRowMultiThreadSync *)x_00,
                 (TileInfo *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (BLOCK_SIZE)((ulong)rd_stats >> 0x38),(int)rd_stats,in_stack_ffffffffffffff87,
                 (int)in_RDX,iVar5);
      rd_cost_00 = (RD_STATS *)**(long **)(pIVar9 + 0x1eb8);
      *(byte *)&rd_cost_00->rate = in_stack_00000010;
      *(undefined1 *)((long)&rd_cost_00->rate + 1) = in_stack_00000008;
      *(undefined1 **)(pIVar9 + 0x1ee8) =
           (undefined1 *)((long)(x_00->e_mbd).plane[0].seg_iqmatrix[2] + 0x71);
      *(uint *)(pIVar9 + 0x1ef0) =
           (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [in_stack_00000010];
      for (iVar5 = 0; iVar5 < mi_col_00; iVar5 = iVar5 + 1) {
        *(tran_low_t **)((long)&mbmi_00->wm_params + (long)iVar5 * 0x88 + -4) =
             (&in_stack_00000018->plane[2].qcoeff)[iVar5];
        *(undefined8 *)(mbmi_00->ref_frame + (long)iVar5 * 0x88) =
             *(undefined8 *)((long)(in_stack_00000018->e_mbd).plane + (long)iVar5 * 8 + -0x78);
        *(undefined8 *)(mbmi_00->mv + (long)iVar5 * 0x22) =
             *(undefined8 *)((long)(in_stack_00000018->e_mbd).plane + (long)iVar5 * 8 + -0x60);
        *(undefined8 *)((long)&mbmi_00->wm_params + (long)iVar5 * 0x88 + 4) =
             *(undefined8 *)
              ((long)(in_stack_00000018->e_mbd).plane[0].pre + (long)iVar5 * 8 + -0x78);
        *(undefined8 *)((long)&mbmi_00->wm_params + (long)iVar5 * 0x88 + 0xc) =
             *(undefined8 *)((long)((in_stack_00000018->e_mbd).plane[0].pre + -3) + (long)iVar5 * 8)
        ;
      }
      for (iVar5 = 0; iVar5 < 2; iVar5 = iVar5 + 1) {
        *(int16_t **)(piVar7 + (long)iVar5 * 0xa30 + 0xa0) =
             (&in_stack_00000018->plane[1].dequant_QTX)[iVar5];
      }
      (in_stack_00000018->e_mbd).mi_col = 0;
      *(undefined1 *)&rd_cost_00[3].sse = 0;
      *(ushort *)((long)&rd_cost_00[4].zero_rate + 3) =
           *(ushort *)((long)&rd_cost_00[4].zero_rate + 3) & 0xffbf;
      uVar1 = av1_get_perpixel_variance_facade
                        ((AV1_COMP *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff78,ref,(BLOCK_SIZE)((ulong)uVar2 >> 0x38),(int)uVar2
                        );
      mult = (int)((ulong)ref >> 0x20);
      in_RDX[0x366].wm_params.wmmat[1] = uVar1;
      set_mode_eval_params
                ((AV1_COMP *)CONCAT17(cVar6,in_stack_ffffffffffffffa0),x_00,
                 (MODE_EVAL_TYPE)((uint)iVar5 >> 0x18));
      mi_col_01._0_1_ = in_RDX[0x60].motion_mode;
      mi_col_01._1_1_ = in_RDX[0x60].num_proj_ref;
      mi_col_01._2_1_ = in_RDX[0x60].overlappable_neighbors;
      mi_col_01._3_1_ = in_RDX[0x60].field_0x1b;
      pRVar8 = rd_cost_00;
      setup_block_rdmult((AV1_COMP *)CONCAT17(cVar6,in_stack_ffffffffffffffa0),x_00,iVar5,mi_col_01,
                         (BLOCK_SIZE)((ulong)rd_stats >> 0x38),(AQ_MODE)((ulong)rd_stats >> 0x30),
                         mbmi_00);
      iVar5._0_1_ = in_RDX[0x60].motion_mode;
      iVar5._1_1_ = in_RDX[0x60].num_proj_ref;
      iVar5._2_1_ = in_RDX[0x60].overlappable_neighbors;
      iVar5._3_1_ = in_RDX[0x60].field_0x1b;
      av1_set_error_per_bit((int *)(in_RDX[0x1eb].inter_tx_size + 6),iVar5);
      av1_rd_cost_update(mult,rd_cost_00);
      if (*(int *)(in_RDI + 0x609dc) == 0) {
        av1_invalid_rd_stats(rd_stats);
      }
      iVar5 = frame_is_intra_only(cm_00);
      if (iVar5 == 0) {
        iVar5 = segfeature_active(&cm_00->seg,
                                  (byte)*(undefined2 *)((long)&pRVar8[4].zero_rate + 3) & 7,'\x06');
        if (iVar5 == 0) {
          av1_rd_pick_inter_mode
                    (in_stack_00005820,in_stack_00005818,in_stack_00005810,in_stack_00005808,
                     in_stack_00005807,in_stack_000057f8,in_stack_00005860);
        }
        else {
          av1_rd_pick_inter_mode_sb_seg_skip
                    (in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,
                     in_stack_000001c8,in_stack_000001c0,in_stack_000001f0,in_stack_000001f8,
                     in_stack_00000200);
        }
      }
      else {
        av1_rd_pick_intra_mode_sb
                  (in_stack_00000020,in_stack_00000018,
                   (RD_STATS *)CONCAT71(in_stack_00000011,in_stack_00000010),in_stack_0000000f,
                   unaff_retaddr,in_RDI);
      }
      if (((*(int *)&in_R9->plane[0].src_diff != 0x7fffffff) && (cVar6 == '\x02')) &&
         (5 < in_stack_00000010)) {
        av1_caq_select_segment
                  ((AV1_COMP *)CONCAT44(in_ECX,in_R8D),in_R9,(BLOCK_SIZE)((ulong)cm_00 >> 0x38),
                   (int)cm_00,mi_col_00,in_stack_ffffffffffffffc8);
      }
      in_RDX[0x60].motion_mode = (char)mi_col_01;
      in_RDX[0x60].num_proj_ref = (char)((uint)mi_col_01 >> 8);
      in_RDX[0x60].overlappable_neighbors = (char)((uint)mi_col_01 >> 0x10);
      in_RDX[0x60].field_0x1b = (char)((uint)mi_col_01 >> 0x18);
      if (*(int *)&in_R9->plane[0].src_diff == 0x7fffffff) {
        in_R9->plane[0].qcoeff = (tran_low_t *)0x7fffffffffffffff;
      }
      (in_stack_00000018->e_mbd).mi_stride = *(int *)&in_R9->plane[0].src_diff;
      *(tran_low_t **)(in_stack_00000018->e_mbd).plane = in_R9->plane[0].dqcoeff;
      *(tran_low_t **)&(in_stack_00000018->e_mbd).plane[0].subsampling_y = in_R9->plane[0].qcoeff;
    }
    else {
      *(int *)&in_R9->plane[0].src_diff = (in_stack_00000018->e_mbd).mi_stride;
      in_R9->plane[0].dqcoeff = *(tran_low_t **)(in_stack_00000018->e_mbd).plane;
      in_R9->plane[0].qcoeff = *(tran_low_t **)&(in_stack_00000018->e_mbd).plane[0].subsampling_y;
    }
  }
  else {
    *(undefined8 *)&(in_stack_00000018->e_mbd).plane[0].subsampling_y = 0x7fffffffffffffff;
    *(undefined1 *)&(in_stack_00000018->e_mbd).plane[0].dst.buf0 = 0;
    av1_invalid_rd_stats((RD_STATS *)in_R9);
  }
  return;
}

Assistant:

static void pick_sb_modes(AV1_COMP *const cpi, TileDataEnc *tile_data,
                          MACROBLOCK *const x, int mi_row, int mi_col,
                          RD_STATS *rd_cost, PARTITION_TYPE partition,
                          BLOCK_SIZE bsize, PICK_MODE_CONTEXT *ctx,
                          RD_STATS best_rd) {
  if (cpi->sf.part_sf.use_best_rd_for_pruning && best_rd.rdcost < 0) {
    ctx->rd_stats.rdcost = INT64_MAX;
    ctx->rd_stats.skip_txfm = 0;
    av1_invalid_rd_stats(rd_cost);
    return;
  }

  av1_set_offsets(cpi, &tile_data->tile_info, x, mi_row, mi_col, bsize);

  if (cpi->sf.part_sf.reuse_prev_rd_results_for_part_ab &&
      ctx->rd_mode_is_ready) {
    assert(ctx->mic.bsize == bsize);
    assert(ctx->mic.partition == partition);
    rd_cost->rate = ctx->rd_stats.rate;
    rd_cost->dist = ctx->rd_stats.dist;
    rd_cost->rdcost = ctx->rd_stats.rdcost;
    return;
  }

  AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *mbmi;
  struct macroblock_plane *const p = x->plane;
  struct macroblockd_plane *const pd = xd->plane;
  const AQ_MODE aq_mode = cpi->oxcf.q_cfg.aq_mode;
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;

  int i;

  // This is only needed for real time/allintra row-mt enabled multi-threaded
  // encoding with cost update frequency set to COST_UPD_TILE/COST_UPD_OFF.
  wait_for_top_right_sb(&cpi->mt_info.enc_row_mt, &tile_data->row_mt_sync,
                        &tile_data->tile_info, cm->seq_params->sb_size,
                        cm->seq_params->mib_size_log2, bsize, mi_row, mi_col);

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, rd_pick_sb_modes_time);
#endif

  mbmi = xd->mi[0];
  mbmi->bsize = bsize;
  mbmi->partition = partition;

#if CONFIG_RD_DEBUG
  mbmi->mi_row = mi_row;
  mbmi->mi_col = mi_col;
#endif

  // Sets up the tx_type_map buffer in MACROBLOCKD.
  xd->tx_type_map = txfm_info->tx_type_map_;
  xd->tx_type_map_stride = mi_size_wide[bsize];

  for (i = 0; i < num_planes; ++i) {
    p[i].coeff = ctx->coeff[i];
    p[i].qcoeff = ctx->qcoeff[i];
    p[i].dqcoeff = ctx->dqcoeff[i];
    p[i].eobs = ctx->eobs[i];
    p[i].txb_entropy_ctx = ctx->txb_entropy_ctx[i];
  }

  for (i = 0; i < 2; ++i) pd[i].color_index_map = ctx->color_index_map[i];

  ctx->skippable = 0;
  // Set to zero to make sure we do not use the previous encoded frame stats
  mbmi->skip_txfm = 0;
  // Reset skip mode flag.
  mbmi->skip_mode = 0;

  x->source_variance = av1_get_perpixel_variance_facade(
      cpi, xd, &x->plane[0].src, bsize, AOM_PLANE_Y);

  // Initialize default mode evaluation params
  set_mode_eval_params(cpi, x, DEFAULT_EVAL);

  // Save rdmult before it might be changed, so it can be restored later.
  const int orig_rdmult = x->rdmult;
  setup_block_rdmult(cpi, x, mi_row, mi_col, bsize, aq_mode, mbmi);
  // Set error per bit for current rdmult
  av1_set_error_per_bit(&x->errorperbit, x->rdmult);
  av1_rd_cost_update(x->rdmult, &best_rd);

  // If set best_rd.rdcost to INT64_MAX, the encoder will not use any previous
  // rdcost information for the following mode search.
  // Disabling the feature could get some coding gain, with encoder slowdown.
  if (!cpi->sf.part_sf.use_best_rd_for_pruning) {
    av1_invalid_rd_stats(&best_rd);
  }

  // Find best coding mode & reconstruct the MB so it is available
  // as a predictor for MBs that follow in the SB
  if (frame_is_intra_only(cm)) {
#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, av1_rd_pick_intra_mode_sb_time);
#endif
    av1_rd_pick_intra_mode_sb(cpi, x, rd_cost, bsize, ctx, best_rd.rdcost);
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, av1_rd_pick_intra_mode_sb_time);
#endif
  } else {
#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, av1_rd_pick_inter_mode_sb_time);
#endif
    if (segfeature_active(&cm->seg, mbmi->segment_id, SEG_LVL_SKIP)) {
      av1_rd_pick_inter_mode_sb_seg_skip(cpi, tile_data, x, mi_row, mi_col,
                                         rd_cost, bsize, ctx, best_rd.rdcost);
    } else {
      av1_rd_pick_inter_mode(cpi, tile_data, x, rd_cost, bsize, ctx,
                             best_rd.rdcost);
    }
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, av1_rd_pick_inter_mode_sb_time);
#endif
  }

  // Examine the resulting rate and for AQ mode 2 make a segment choice.
  if (rd_cost->rate != INT_MAX && aq_mode == COMPLEXITY_AQ &&
      bsize >= BLOCK_16X16) {
    av1_caq_select_segment(cpi, x, bsize, mi_row, mi_col, rd_cost->rate);
  }

  x->rdmult = orig_rdmult;

  // TODO(jingning) The rate-distortion optimization flow needs to be
  // refactored to provide proper exit/return handle.
  if (rd_cost->rate == INT_MAX) rd_cost->rdcost = INT64_MAX;

  ctx->rd_stats.rate = rd_cost->rate;
  ctx->rd_stats.dist = rd_cost->dist;
  ctx->rd_stats.rdcost = rd_cost->rdcost;

#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, rd_pick_sb_modes_time);
#endif
}